

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12CachePolicy.cpp
# Opt level: O2

int32_t __thiscall
GmmLib::GmmGen12CachePolicy::IsSpecialMOCSUsage
          (GmmGen12CachePolicy *this,GMM_RESOURCE_USAGE_TYPE Usage,bool *UpdateMOCS)

{
  anon_union_8_2_649915e9_for_GMM_CACHE_POLICY_ELEMENT_REC_1 *paVar1;
  GMM_CACHE_POLICY_ELEMENT *pGVar2;
  int32_t iVar3;
  
  *UpdateMOCS = true;
  if (Usage - GMM_RESOURCE_USAGE_L3_EVICTION_SPECIAL < 2) {
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[Usage].field_1;
    paVar1->Value = paVar1->Value | 4;
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[Usage].field_1;
    paVar1->Value = paVar1->Value | 0x180000;
    iVar3 = 0x3d;
  }
  else if (Usage == GMM_RESOURCE_USAGE_L3_EVICTION) {
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x3a].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    pGVar2 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar2[0x3a].field_1.Value = pGVar2[0x3a].field_1.Value & 0xffffffffffe7ffff | 0x100000;
    iVar3 = 0x3f;
  }
  else if (Usage == GMM_RESOURCE_USAGE_MOCS_62) {
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x39].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    iVar3 = 0x3e;
  }
  else if (Usage == GMM_RESOURCE_USAGE_CCS) {
    paVar1 = &(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[0x1d].field_1;
    paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
    iVar3 = 0x3c;
  }
  else {
    *UpdateMOCS = false;
    iVar3 = -1;
  }
  if ((~*(uint *)&(this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                  super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
                  pCachePolicy[Usage].field_1 & 0x180000) == 0) {
    iVar3 = 0x3d;
  }
  return iVar3;
}

Assistant:

int32_t GmmLib::GmmGen12CachePolicy::IsSpecialMOCSUsage(GMM_RESOURCE_USAGE_TYPE Usage, bool &UpdateMOCS)
{
    int32_t MocsIdx = -1;
    UpdateMOCS      = true;
//Macros for L3-Eviction Type
#define NA 0x0
#define RO 0x1
#define RW 0x2
#define SP 0x3

    switch(Usage)
    {
        case GMM_RESOURCE_USAGE_CCS:
            __GMM_ASSERT(pCachePolicy[Usage].L3 == 0); //Architecturally, CCS isn't L3-cacheable.

            pCachePolicy[Usage].L3 = 0;
            MocsIdx                = 60;
            break;
        case GMM_RESOURCE_USAGE_MOCS_62:
            __GMM_ASSERT(pCachePolicy[Usage].L3 == 0); //Architecturally, TR/Aux-TT node isn't L3-cacheable.

            pCachePolicy[Usage].L3 = 0;
            MocsIdx                = 62;
            break;
        case GMM_RESOURCE_USAGE_L3_EVICTION:
            __GMM_ASSERT(pCachePolicy[Usage].L3 == 0 &&
                         pCachePolicy[Usage].L3Eviction == RW); //Reserved MOCS for L3-evictions

            pCachePolicy[Usage].L3         = 0;
            pCachePolicy[Usage].L3Eviction = RW;
            MocsIdx                        = 63;
            break;
        case GMM_RESOURCE_USAGE_L3_EVICTION_SPECIAL:
        case GMM_RESOURCE_USAGE_CCS_MEDIA_WRITABLE:
            __GMM_ASSERT(pCachePolicy[Usage].L3 &&
                         pCachePolicy[Usage].L3Eviction == SP); //Reserved MOCS for L3-evictions
                                                                //Special-case for Displayable, and similar non-LLC accesses
            GMM_ASSERTDPF(pCachePolicy[Usage].LLC == 0, "MOCS#61's Special Eviction isn't for LLC caching");

            pCachePolicy[Usage].L3         = 1;
            pCachePolicy[Usage].L3Eviction = SP;
            MocsIdx                        = 61;
            break;
        default:
            UpdateMOCS = false;
            break;
    }

    if(pCachePolicy[Usage].L3Eviction == RW)
    {
        GMM_CACHE_POLICY_ELEMENT L3Eviction;
        L3Eviction.Value = pCachePolicy[GMM_RESOURCE_USAGE_L3_EVICTION].Value;

        //For internal purpose, hw overrides MOCS#63 as L3-uncacheable, still using it for L3-evictions
        if(Usage != GMM_RESOURCE_USAGE_L3_EVICTION)
        {
            L3Eviction.L3 = 1; //Override L3, to verify MOCS#63 applicable or not
        }

        __GMM_ASSERT(pCachePolicy[Usage].Value == L3Eviction.Value); //Allow mis-match due to override registries
        //MocsIdx = 63;    //Use non-#63 MOCS, #63 itself is L3-uncached
    }
    else if(pCachePolicy[Usage].L3Eviction == SP)
    {
        __GMM_ASSERT(pCachePolicy[Usage].Value == pCachePolicy[GMM_RESOURCE_USAGE_L3_EVICTION_SPECIAL].Value); //Allow mis-match due to override registries
        MocsIdx = 61;
    }

    return MocsIdx;
}